

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_util.h
# Opt level: O3

void webrtc::DownmixInterleavedToMonoImpl<short,int>
               (short *interleaved,size_t num_frames,int num_channels,short *deinterleaved)

{
  int iVar1;
  string *result;
  short *psVar2;
  short *psVar3;
  long lVar4;
  int local_1a4;
  size_t local_1a0;
  FatalMessage local_198;
  
  local_1a4 = 0;
  local_1a0 = num_frames;
  if ((num_channels < 1) &&
     (local_198._0_4_ = num_channels,
     result = rtc::MakeCheckOpString<int,int>((int *)&local_198,&local_1a4,"num_channels > 0"),
     result != (string *)0x0)) {
    iVar1 = 0x9c;
  }
  else {
    local_198._0_4_ = 0;
    if ((num_frames != 0) ||
       (result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                           (&local_1a0,(uint *)&local_198,"num_frames > 0u"), num_frames = local_1a0
       , result == (string *)0x0)) {
      lVar4 = num_frames * (long)num_channels;
      if (0 < lVar4) {
        psVar3 = interleaved;
        do {
          psVar2 = psVar3 + 1;
          iVar1 = (int)*psVar3;
          if (1 < num_channels) {
            do {
              iVar1 = iVar1 + *psVar2;
              psVar2 = psVar2 + 1;
            } while (psVar2 < psVar3 + num_channels);
          }
          *deinterleaved = (short)(iVar1 / num_channels);
          deinterleaved = deinterleaved + 1;
          psVar3 = psVar2;
        } while (psVar2 < interleaved + lVar4);
      }
      return;
    }
    iVar1 = 0x9d;
  }
  rtc::FatalMessage::FatalMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/include/audio_util.h"
             ,iVar1,result);
  rtc::FatalMessage::~FatalMessage(&local_198);
}

Assistant:

void DownmixInterleavedToMonoImpl(const T* interleaved,
                                  size_t num_frames,
                                  int num_channels,
                                  T* deinterleaved) {
  RTC_DCHECK_GT(num_channels, 0);
  RTC_DCHECK_GT(num_frames, 0u);

  const T* const end = interleaved + num_frames * num_channels;

  while (interleaved < end) {
    const T* const frame_end = interleaved + num_channels;

    Intermediate value = *interleaved++;
    while (interleaved < frame_end) {
      value += *interleaved++;
    }

    *deinterleaved++ = value / num_channels;
  }
}